

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::FileGenerator::GenerateSource(FileGenerator *this,Printer *printer)

{
  bool bVar1;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *psVar2;
  MessageGenerator *pMVar3;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_00;
  EnumGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator> *this_02;
  ServiceGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_04;
  ExtensionGenerator *this_05;
  string *filename;
  int i_2;
  FileDescriptor *pFVar4;
  int i;
  long lVar5;
  long lVar6;
  string local_50;
  
  filename = *(string **)this->file_;
  StripProto(&local_50,filename);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n#include \"$basename$.pb.h\"\n\n#include <algorithm>\n\n#include <google/protobuf/stubs/common.h>\n#include <google/protobuf/stubs/once.h>\n#include <google/protobuf/io/coded_stream.h>\n#include <google/protobuf/wire_format_lite_inl.h>\n"
                     ,"filename",filename,"basename",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "#include <google/protobuf/descriptor.h>\n#include <google/protobuf/generated_message_reflection.h>\n#include <google/protobuf/reflection_ops.h>\n#include <google/protobuf/wire_format.h>\n"
                      );
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
  GenerateNamespaceOpeners(this,printer);
  if (*(int *)(*(long *)(this->file_ + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"\nnamespace {\n\n");
    for (lVar5 = 0; pFVar4 = this->file_, lVar5 < *(int *)(pFVar4 + 0x48); lVar5 = lVar5 + 1) {
      psVar2 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar5);
      pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                         (psVar2);
      MessageGenerator::GenerateDescriptorDeclarations(pMVar3,printer);
    }
    lVar5 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(pFVar4 + 0x58); lVar6 = lVar6 + 1) {
      ClassName_abi_cxx11_
                (&local_50,(cxx *)(*(long *)(pFVar4 + 0x60) + lVar5),(EnumDescriptor *)0x0,
                 SUB81(filename,0));
      filename = &local_50;
      io::Printer::Print(printer,
                         "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
                         "name",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pFVar4 = this->file_;
      lVar5 = lVar5 + 0x38;
    }
    bVar1 = HasGenericServices(pFVar4);
    if (bVar1) {
      lVar6 = 0;
      for (lVar5 = 0; lVar5 < *(int *)(this->file_ + 0x68); lVar5 = lVar5 + 1) {
        io::Printer::Print(printer,
                           "const ::google::protobuf::ServiceDescriptor* $name$_descriptor_ = NULL;\n"
                           ,"name",*(string **)(*(long *)(this->file_ + 0x70) + lVar6));
        lVar6 = lVar6 + 0x30;
      }
    }
    io::Printer::Print(printer,"\n}  // namespace\n\n");
  }
  GenerateBuildDescriptors(this,printer);
  for (lVar5 = 0; pFVar4 = this->file_, lVar5 < *(int *)(pFVar4 + 0x58); lVar5 = lVar5 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,lVar5);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_00);
    EnumGenerator::GenerateMethods(this_01,printer);
  }
  for (lVar5 = 0; lVar5 < *(int *)(pFVar4 + 0x48); lVar5 = lVar5 + 1) {
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// ===================================================================\n");
    io::Printer::Print(printer,"\n");
    psVar2 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
             ::operator[](&this->message_generators_,lVar5);
    pMVar3 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                       (psVar2);
    MessageGenerator::GenerateClassMethods(pMVar3,printer);
    pFVar4 = this->file_;
  }
  bVar1 = HasGenericServices(pFVar4);
  if (bVar1) {
    for (lVar5 = 0; lVar5 < *(int *)(this->file_ + 0x68); lVar5 = lVar5 + 1) {
      if (lVar5 == 0) {
        io::Printer::Print(printer,"\n");
      }
      io::Printer::Print(printer,
                         "// ===================================================================\n")
      ;
      io::Printer::Print(printer,"\n");
      this_02 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>_>
                ::operator[](&this->service_generators_,lVar5);
      this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::ServiceGenerator>::operator->
                          (this_02);
      ServiceGenerator::GenerateImplementation(this_03,printer);
    }
  }
  for (lVar5 = 0; lVar5 < *(int *)(this->file_ + 0x78); lVar5 = lVar5 + 1) {
    this_04 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar5);
    this_05 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_04);
    ExtensionGenerator::GenerateDefinition(this_05,printer);
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
  GenerateNamespaceClosers(this,printer);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n");
  return;
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n"

    // The generated code calls accessors that might be deprecated. We don't
    // want the compiler to warn in generated code.
    "#define INTERNAL_SUPPRESS_PROTOBUF_FIELD_DEPRECATION\n"
    "#include \"$basename$.pb.h\"\n"
    "\n"
    "#include <algorithm>\n"    // for swap()
    "\n"
    "#include <google/protobuf/stubs/common.h>\n"
    "#include <google/protobuf/stubs/once.h>\n"
    "#include <google/protobuf/io/coded_stream.h>\n"
    "#include <google/protobuf/wire_format_lite_inl.h>\n",
    "filename", file_->name(),
    "basename", StripProto(file_->name()));

  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "#include <google/protobuf/descriptor.h>\n"
      "#include <google/protobuf/generated_message_reflection.h>\n"
      "#include <google/protobuf/reflection_ops.h>\n"
      "#include <google/protobuf/wire_format.h>\n");
  }

  printer->Print(
    "// @@protoc_insertion_point(includes)\n");

  GenerateNamespaceOpeners(printer);

  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "\n"
      "namespace {\n"
      "\n");
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateDescriptorDeclarations(printer);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      printer->Print(
        "const ::google::protobuf::EnumDescriptor* $name$_descriptor_ = NULL;\n",
        "name", ClassName(file_->enum_type(i), false));
    }

    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        printer->Print(
          "const ::google::protobuf::ServiceDescriptor* $name$_descriptor_ = NULL;\n",
          "name", file_->service(i)->name());
      }
    }

    printer->Print(
      "\n"
      "}  // namespace\n"
      "\n");
  }

  // Define our externally-visible BuildDescriptors() function.  (For the lite
  // library, all this does is initialize default instances.)
  GenerateBuildDescriptors(printer);

  // Generate enums.
  for (int i = 0; i < file_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateMethods(printer);
  }

  // Generate classes.
  for (int i = 0; i < file_->message_type_count(); i++) {
    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
    message_generators_[i]->GenerateClassMethods(printer);
  }

  if (HasGenericServices(file_)) {
    // Generate services.
    for (int i = 0; i < file_->service_count(); i++) {
      if (i == 0) printer->Print("\n");
      printer->Print(kThickSeparator);
      printer->Print("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }

  // Define extensions.
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(namespace_scope)\n");

  GenerateNamespaceClosers(printer);

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}